

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua_cjson.c
# Opt level: O0

int decode_hex4(char *hex)

{
  int iVar1;
  int local_2c;
  int local_28;
  int i;
  int digit [4];
  char *hex_local;
  
  local_2c = 0;
  digit._8_8_ = hex;
  while( true ) {
    if (3 < local_2c) {
      return local_28 * 0x1000 + i * 0x100 + digit[0] * 0x10 + digit[1];
    }
    iVar1 = hexdigit2int(*(char *)(digit._8_8_ + (long)local_2c));
    (&local_28)[local_2c] = iVar1;
    if ((&local_28)[local_2c] < 0) break;
    local_2c = local_2c + 1;
  }
  return -1;
}

Assistant:

static int decode_hex4(const char *hex)
{
    int digit[4];
    int i;

    /* Convert ASCII hex digit to numeric digit
     * Note: this returns an error for invalid hex digits, including
     *       NULL */
    for (i = 0; i < 4; i++) {
        digit[i] = hexdigit2int(hex[i]);
        if (digit[i] < 0) {
            return -1;
        }
    }

    return (digit[0] << 12) +
           (digit[1] << 8) +
           (digit[2] << 4) +
            digit[3];
}